

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingSizeMismatchedUniformFunctions
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  _uniform_function func;
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  char *__s;
  size_t sVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  undefined8 *puVar9;
  GPUShaderFP64Test1 *this_01;
  double double_data [16];
  int data [72];
  undefined8 local_358 [16];
  undefined1 local_2d8 [120];
  ios_base local_260 [264];
  undefined4 local_158;
  GLint local_154;
  undefined8 local_150;
  GLint local_148;
  undefined8 local_144;
  GLint local_13c;
  undefined8 local_138;
  GLint local_130;
  undefined8 local_12c;
  GLint local_124;
  undefined8 local_120;
  GLint local_118;
  undefined8 local_114;
  GLint local_10c;
  undefined8 local_108;
  GLint local_100;
  undefined8 local_fc;
  GLint local_f4;
  undefined8 local_f0;
  GLint local_e8;
  undefined8 local_e4;
  GLint local_dc;
  undefined8 local_d8;
  GLint local_d0;
  undefined8 local_cc;
  GLint local_c4;
  undefined8 local_c0;
  GLint local_b8;
  undefined8 local_b4;
  GLint local_ac;
  undefined8 local_a8;
  GLint local_a0;
  undefined8 local_9c;
  GLint local_94;
  undefined8 local_90;
  GLint local_88;
  undefined8 local_84;
  GLint local_7c;
  undefined8 local_78;
  GLint local_70;
  undefined8 local_6c;
  GLint local_64;
  undefined8 local_60;
  GLint local_58;
  undefined8 local_54;
  GLint local_4c;
  undefined8 local_48;
  GLint local_40;
  undefined4 local_3c;
  
  puVar7 = &DAT_01a7f130;
  puVar9 = local_358;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar9 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar9 = puVar9 + 1;
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  puVar7 = &local_150;
  local_158 = 2;
  local_154 = this->m_po_double_uniform_location;
  local_150 = 0x300000000;
  local_144 = 0x400000002;
  local_138 = 0x500000000;
  local_12c = 0x600000002;
  local_120 = 0x700000000;
  local_114 = 2;
  local_10c = this->m_po_dvec2_uniform_location;
  local_108 = 0x100000000;
  local_fc = 0x400000002;
  local_f0 = 0x500000000;
  local_e4 = 0x600000002;
  local_d8 = 0x700000000;
  local_cc = 2;
  local_c4 = this->m_po_dvec3_uniform_location;
  local_c0 = 0x100000000;
  local_b4 = 0x200000002;
  local_a8 = 0x300000000;
  local_9c = 0x600000002;
  local_90 = 0x700000000;
  local_84 = 2;
  local_7c = this->m_po_dvec4_uniform_location;
  local_78 = 0x100000000;
  local_6c = 0x200000002;
  local_60 = 0x300000000;
  local_54 = 0x400000002;
  local_48 = 0x500000000;
  local_3c = 2;
  local_148 = local_154;
  local_13c = local_154;
  local_130 = local_154;
  local_124 = local_154;
  local_118 = local_154;
  local_100 = local_10c;
  local_f4 = local_10c;
  local_e8 = local_10c;
  local_dc = local_10c;
  local_d0 = local_10c;
  local_b8 = local_c4;
  local_ac = local_c4;
  local_a0 = local_c4;
  local_94 = local_c4;
  local_88 = local_c4;
  local_70 = local_7c;
  local_64 = local_7c;
  local_58 = local_7c;
  local_4c = local_7c;
  local_40 = local_7c;
  (**(code **)(lVar6 + 0x1680))(this->m_po_id);
  err = (**(code **)(lVar6 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xba5);
  this_00 = (GPUShaderFP64Test1 *)(local_2d8 + 8);
  bVar3 = true;
  lVar8 = 0;
  do {
    func = *(_uniform_function *)(puVar7 + -1);
    if (func < UNIFORM_FUNCTION_MATRIX2DV) {
      uVar1 = *(undefined4 *)((long)puVar7 + -4);
      uVar2 = *(undefined4 *)puVar7;
      switch(func) {
      case UNIFORM_FUNCTION_1D:
        (**(code **)(lVar6 + 0x14d0))(0);
        break;
      case UNIFORM_FUNCTION_1DV:
        (**(code **)(lVar6 + 0x14d8))(uVar1,uVar2,local_358);
        break;
      case UNIFORM_FUNCTION_2D:
        (**(code **)(lVar6 + 0x1510))(0,0x3ff0000000000000);
        break;
      case UNIFORM_FUNCTION_2DV:
        (**(code **)(lVar6 + 0x1518))(uVar1,uVar2,local_358);
        break;
      case UNIFORM_FUNCTION_3D:
        (**(code **)(lVar6 + 0x1550))(0,0x3ff0000000000000,0x4000000000000000);
        break;
      case UNIFORM_FUNCTION_3DV:
        (**(code **)(lVar6 + 0x1558))(uVar1,uVar2,local_358);
        break;
      case UNIFORM_FUNCTION_4D:
        (**(code **)(lVar6 + 0x1590))(0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000);
        break;
      case UNIFORM_FUNCTION_4DV:
        (**(code **)(lVar6 + 0x1598))(uVar1,uVar2,local_358);
      }
    }
    iVar4 = (**(code **)(lVar6 + 0x800))();
    if (iVar4 != 0x502) {
      local_2d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_01 = this_00;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      __s = getUniformFunctionString(this_01,func);
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "() function did not generate GL_INVALID_OPERATION error when called for a uniform of incompatible size. (check index: "
                 ,0x76);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_2d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      std::ios_base::~ios_base(local_260);
      bVar3 = false;
    }
    lVar8 = lVar8 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 0xc);
  } while (lVar8 != 0x18);
  return bVar3;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingSizeMismatchedUniformFunctions()
{
	const double		  double_data[] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };
	glw::GLenum			  error_code	= GL_NO_ERROR;
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	bool				  result		= true;

	const int data[] = {
		/* API function */ /* Uniform location */ /* Count (dv functions only) */
		(int)UNIFORM_FUNCTION_2D, m_po_double_uniform_location, 0, (int)UNIFORM_FUNCTION_2DV,
		m_po_double_uniform_location, 2, (int)UNIFORM_FUNCTION_3D, m_po_double_uniform_location, 0,
		(int)UNIFORM_FUNCTION_3DV, m_po_double_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_double_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_double_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec2_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec2_uniform_location, 2, (int)UNIFORM_FUNCTION_3D, m_po_dvec2_uniform_location, 0,
		(int)UNIFORM_FUNCTION_3DV, m_po_dvec2_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_dvec2_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_dvec2_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec3_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec3_uniform_location, 2, (int)UNIFORM_FUNCTION_2D, m_po_dvec3_uniform_location, 0,
		(int)UNIFORM_FUNCTION_2DV, m_po_dvec3_uniform_location, 2, (int)UNIFORM_FUNCTION_4D,
		m_po_dvec3_uniform_location, 0, (int)UNIFORM_FUNCTION_4DV, m_po_dvec3_uniform_location, 2,
		(int)UNIFORM_FUNCTION_1D, m_po_dvec4_uniform_location, 0, (int)UNIFORM_FUNCTION_1DV,
		m_po_dvec4_uniform_location, 2, (int)UNIFORM_FUNCTION_2D, m_po_dvec4_uniform_location, 0,
		(int)UNIFORM_FUNCTION_2DV, m_po_dvec4_uniform_location, 2, (int)UNIFORM_FUNCTION_3D,
		m_po_dvec4_uniform_location, 0, (int)UNIFORM_FUNCTION_3DV, m_po_dvec4_uniform_location, 2,
	};
	const unsigned int n_checks = sizeof(data) / sizeof(data[0]) / 3 /* entries per row */;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	for (unsigned int n_check = 0; n_check < n_checks; ++n_check)
	{
		_uniform_function function		   = (_uniform_function)data[n_check * 3 + 0];
		int				  uniform_location = data[n_check * 3 + 1];
		int				  uniform_count	= data[n_check * 3 + 2];

		switch (function)
		{
		case UNIFORM_FUNCTION_1D:
			gl.uniform1d(uniform_location, 0.0);
			break;
		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_2D:
			gl.uniform2d(uniform_location, 0.0, 1.0);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_3D:
			gl.uniform3d(uniform_location, 0.0, 1.0, 2.0);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(uniform_location, uniform_count, double_data);
			break;
		case UNIFORM_FUNCTION_4D:
			gl.uniform4d(uniform_location, 0.0, 1.0, 2.0, 3.0);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(uniform_location, uniform_count, double_data);
			break;

		default:
		{
			DE_ASSERT(false);
		}
		} /* switch (function) */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << getUniformFunctionString(function)
							   << "() function did not generate GL_INVALID_OPERATION error when called for"
								  " a uniform of incompatible size. (check index: "
							   << n_check << ")" << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all checks) */

	return result;
}